

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qmainwindowlayout_p.cpp
# Opt level: O0

void QDockWidgetGroupWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  QDockWidgetGroupWindow *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    resized((QDockWidgetGroupWindow *)0x5fe3df);
  }
  if (in_ESI == 5) {
    QtMocHelpers::indexOfMethod<void(QDockWidgetGroupWindow::*)()>(in_RCX,(void **)resized,0,0);
  }
  return;
}

Assistant:

void QDockWidgetGroupWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDockWidgetGroupWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->resized(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDockWidgetGroupWindow::*)()>(_a, &QDockWidgetGroupWindow::resized, 0))
            return;
    }
}